

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modeq.cpp
# Opt level: O3

ll solve_modeq(ll a,ll b,ll m)

{
  long lVar1;
  long lVar2;
  ll lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar3 = m;
  lVar5 = a % m;
  do {
    lVar2 = lVar3;
    lVar3 = lVar5 % lVar2;
    lVar5 = lVar2;
  } while (lVar3 != 0);
  lVar3 = -1;
  if ((b % m) % lVar2 == 0) {
    lVar5 = a % m;
    lVar3 = m;
    lVar1 = 0;
    lVar7 = 1;
    do {
      lVar6 = lVar1;
      lVar1 = lVar5 / lVar3;
      lVar4 = lVar5 % lVar3;
      lVar5 = lVar3;
      lVar3 = lVar4;
      lVar1 = lVar7 - lVar1 * lVar6;
      lVar7 = lVar6;
    } while (lVar4 != 0);
    lVar3 = ((lVar6 * ((b % m) / lVar2)) % m + m) % m;
  }
  return lVar3;
}

Assistant:

ll solve_modeq(ll a, ll b, ll m) {
	// We have a * k + m * y = b for unknown k and y
	a %= m, b %= m;
	ll g = gcd(a, m);
	if (b % g)
		return -1;

	ll t = b / g;
	ll k = extgcd(a, m).first * t;
	return (k % m + m) % m;
}